

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::
     RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYRef<signed_char>,ImPlot::TransformerLinLog>>
               (ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLinLog>
                *renderer,ImDrawList *DrawList,ImRect *cull_rect)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int prim;
  ImVec2 uv;
  
  uVar9 = renderer->Prims;
  uv = DrawList->_Data->TexUvWhitePixel;
  uVar7 = 0;
  prim = 0;
  do {
    if (uVar9 == 0) {
      if (uVar7 != 0) {
        ImDrawList::PrimUnreserve(DrawList,uVar7 * 6,uVar7 * 5);
      }
      return;
    }
    uVar4 = (ulong)(0xffff - DrawList->_VtxCurrentIdx) / 5;
    uVar2 = (uint)uVar4;
    if (uVar9 < uVar2) {
      uVar4 = (ulong)uVar9;
    }
    uVar6 = 0x40;
    if (uVar9 < 0x40) {
      uVar6 = uVar9;
    }
    if (uVar2 < uVar6) {
      if (uVar7 != 0) {
        ImDrawList::PrimUnreserve(DrawList,uVar7 * 6,uVar7 * 5);
      }
      uVar4 = 0x3333;
      if (uVar9 < 0x3333) {
        uVar4 = (ulong)uVar9;
      }
      iVar3 = (int)uVar4;
LAB_0022975c:
      ImDrawList::PrimReserve(DrawList,iVar3 * 6,iVar3 * 5);
      uVar2 = 0;
    }
    else {
      uVar6 = (uint)uVar4;
      uVar2 = uVar7 - uVar6;
      if (uVar7 < uVar6) {
        iVar3 = uVar6 - uVar7;
        goto LAB_0022975c;
      }
    }
    uVar7 = uVar2;
    iVar3 = (int)uVar4;
    iVar5 = iVar3 + prim;
    while (iVar8 = (int)uVar4, uVar4 = (ulong)(iVar8 - 1), iVar8 != 0) {
      bVar1 = ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLinLog>
              ::operator()(renderer,DrawList,cull_rect,&uv,prim);
      uVar7 = uVar7 + !bVar1;
      prim = prim + 1;
    }
    uVar9 = uVar9 - iVar3;
    prim = iVar5;
  } while( true );
}

Assistant:

inline void RenderPrimitives(const Renderer& renderer, ImDrawList& DrawList, const ImRect& cull_rect) {
    unsigned int prims        = renderer.Prims;
    unsigned int prims_culled = 0;
    unsigned int idx          = 0;
    const ImVec2 uv = DrawList._Data->TexUvWhitePixel;
    while (prims) {
        // find how many can be reserved up to end of current draw command's limit
        unsigned int cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - DrawList._VtxCurrentIdx) / Renderer::VtxConsumed);
        // make sure at least this many elements can be rendered to avoid situations where at the end of buffer this slow path is not taken all the time
        if (cnt >= ImMin(64u, prims)) {
            if (prims_culled >= cnt)
                prims_culled -= cnt; // reuse previous reservation
            else {
                DrawList.PrimReserve((cnt - prims_culled) * Renderer::IdxConsumed, (cnt - prims_culled) * Renderer::VtxConsumed); // add more elements to previous reservation
                prims_culled = 0;
            }
        }
        else
        {
            if (prims_culled > 0) {
                DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
                prims_culled = 0;
            }
            cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - 0/*DrawList._VtxCurrentIdx*/) / Renderer::VtxConsumed);
            DrawList.PrimReserve(cnt * Renderer::IdxConsumed, cnt * Renderer::VtxConsumed); // reserve new draw command
        }
        prims -= cnt;
        for (unsigned int ie = idx + cnt; idx != ie; ++idx) {
            if (!renderer(DrawList, cull_rect, uv, idx))
                prims_culled++;
        }
    }
    if (prims_culled > 0)
        DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
}